

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O3

ssize_t __thiscall llvm::raw_ostream::write(raw_ostream *this,int __fd,void *__buf,size_t __n)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  undefined4 in_register_00000034;
  char *Ptr;
  char *Size;
  char *pcVar4;
  
  Ptr = (char *)CONCAT44(in_register_00000034,__fd);
  pcVar1 = this->OutBufEnd;
  pcVar2 = this->OutBufCur;
  Size = pcVar1 + -(long)pcVar2;
  if (pcVar1 + -(long)pcVar2 < __buf) {
    do {
      while (this->OutBufStart != (char *)0x0) {
        if (pcVar2 == this->OutBufStart) {
          if (pcVar1 == pcVar2) {
            __assert_fail("NumBytes != 0 && \"undefined behavior\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/raw_ostream.cpp"
                          ,0x108,"raw_ostream &llvm::raw_ostream::write(const char *, size_t)");
          }
          pcVar4 = (char *)((ulong)__buf % (ulong)Size);
          Size = (char *)((long)__buf + -(long)pcVar4);
          (*this->_vptr_raw_ostream[8])(this,Ptr,Size);
          pcVar1 = this->OutBufEnd;
          pcVar2 = this->OutBufCur;
          pcVar3 = pcVar1 + -(long)pcVar2;
          if (pcVar4 <= pcVar3) {
            Ptr = Ptr + (long)Size;
            __buf = pcVar4;
            goto LAB_00d9c145;
          }
        }
        else {
          copy_to_buffer(this,Ptr,(size_t)Size);
          flush_nonempty(this);
          pcVar4 = (char *)((long)__buf + -(long)Size);
          pcVar1 = this->OutBufEnd;
          pcVar2 = this->OutBufCur;
          pcVar3 = pcVar1 + -(long)pcVar2;
        }
        Ptr = Ptr + (long)Size;
        Size = pcVar3;
        __buf = pcVar4;
        if (pcVar4 <= pcVar3) goto LAB_00d9c145;
      }
      if (this->BufferMode == Unbuffered) {
        (*this->_vptr_raw_ostream[8])(this,Ptr,__buf);
        return (ssize_t)this;
      }
      SetBuffered(this);
      pcVar1 = this->OutBufEnd;
      pcVar2 = this->OutBufCur;
      Size = pcVar1 + -(long)pcVar2;
    } while (pcVar1 + -(long)pcVar2 < __buf);
  }
LAB_00d9c145:
  copy_to_buffer(this,Ptr,(size_t)__buf);
  return (ssize_t)this;
}

Assistant:

raw_ostream &raw_ostream::write(const char *Ptr, size_t Size) {
  // Group exceptional cases into a single branch.
  if (LLVM_UNLIKELY(size_t(OutBufEnd - OutBufCur) < Size)) {
    if (LLVM_UNLIKELY(!OutBufStart)) {
      if (BufferMode == BufferKind::Unbuffered) {
        write_impl(Ptr, Size);
        return *this;
      }
      // Set up a buffer and start over.
      SetBuffered();
      return write(Ptr, Size);
    }

    size_t NumBytes = OutBufEnd - OutBufCur;

    // If the buffer is empty at this point we have a string that is larger
    // than the buffer. Directly write the chunk that is a multiple of the
    // preferred buffer size and put the remainder in the buffer.
    if (LLVM_UNLIKELY(OutBufCur == OutBufStart)) {
      assert(NumBytes != 0 && "undefined behavior");
      size_t BytesToWrite = Size - (Size % NumBytes);
      write_impl(Ptr, BytesToWrite);
      size_t BytesRemaining = Size - BytesToWrite;
      if (BytesRemaining > size_t(OutBufEnd - OutBufCur)) {
        // Too much left over to copy into our buffer.
        return write(Ptr + BytesToWrite, BytesRemaining);
      }
      copy_to_buffer(Ptr + BytesToWrite, BytesRemaining);
      return *this;
    }

    // We don't have enough space in the buffer to fit the string in. Insert as
    // much as possible, flush and start over with the remainder.
    copy_to_buffer(Ptr, NumBytes);
    flush_nonempty();
    return write(Ptr + NumBytes, Size - NumBytes);
  }

  copy_to_buffer(Ptr, Size);

  return *this;
}